

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O2

void project_feature_handler_KILL_WALL(project_feature_handler_context_t *context)

{
  uint32_t *puVar1;
  loc grid;
  chunk_conflict *c;
  player *p;
  _Bool _Var2;
  uint32_t uVar3;
  object *poVar4;
  char *fmt;
  
  grid = context->grid;
  _Var2 = square_ispassable(cave,grid);
  if ((_Var2) && (_Var2 = square_seemslikewall(cave,grid), !_Var2)) {
    return;
  }
  _Var2 = square_isperm(cave,grid);
  if (_Var2) {
    return;
  }
  _Var2 = square_isrubble(cave,grid);
  if (_Var2) {
    _Var2 = square_isseen(cave,grid);
    if (_Var2) {
      msg("The rubble turns into mud!");
      context->obvious = true;
      square_forget(cave,grid);
    }
    square_destroy_rubble(cave,grid);
    uVar3 = Rand_div(100);
    if ((int)uVar3 < 10) {
      place_object(cave,(loc_conflict)grid,(int)player->depth,false,false,'\b',L'\0');
      poVar4 = square_object(cave,grid);
      p = player;
      if (poVar4 != (object *)0x0) {
        poVar4 = square_object(cave,grid);
        _Var2 = ignore_item_ok(p,poVar4);
        if ((!_Var2) && (_Var2 = square_isseen(cave,grid), _Var2)) {
          msg("There was something buried in the rubble!");
          context->obvious = true;
        }
      }
    }
    goto LAB_001b8070;
  }
  _Var2 = square_isdoor(cave,grid);
  if (_Var2) {
    _Var2 = square_isseen(cave,grid);
    if (_Var2) {
      msg("The door turns into mud!");
      context->obvious = true;
      square_forget(cave,grid);
    }
    square_destroy_door(cave,grid);
    goto LAB_001b8070;
  }
  _Var2 = square_hasgoldvein(cave,grid);
  if (_Var2) {
    _Var2 = square_isseen(cave,grid);
    if (_Var2) {
      msg("The vein turns into mud!");
      msg("You have found something!");
      context->obvious = true;
      square_forget(cave,grid);
    }
    square_destroy_wall(cave,grid);
    place_gold(cave,(loc_conflict)grid,(int)player->depth,'\x01');
    goto LAB_001b8070;
  }
  _Var2 = square_ismagma(cave,grid);
  if ((_Var2) || (_Var2 = square_isquartz(cave,grid), _Var2)) {
    _Var2 = square_isseen(cave,grid);
    if (_Var2) {
      fmt = "The vein turns into mud!";
LAB_001b804c:
      msg(fmt);
      context->obvious = true;
      square_forget(cave,grid);
    }
  }
  else {
    _Var2 = square_isgranite(cave,grid);
    if (!_Var2) goto LAB_001b8070;
    _Var2 = square_isseen(cave,grid);
    if (_Var2) {
      fmt = "The wall turns into mud!";
      goto LAB_001b804c;
    }
  }
  square_destroy_wall(cave,grid);
LAB_001b8070:
  c = cave;
  if (cave->depth == 0) {
    _Var2 = is_daytime();
    expose_to_sun((chunk *)c,grid,_Var2);
  }
  puVar1 = &player->upkeep->update;
  *puVar1 = *puVar1 | 0xc0;
  return;
}

Assistant:

static void project_feature_handler_KILL_WALL(project_feature_handler_context_t *context)
{
	const struct loc grid = context->grid;

	/* Non-walls (etc) */
	if (square_ispassable(cave, grid) && !square_seemslikewall(cave, grid))
		return;

	/* Permanent walls */
	if (square_isperm(cave, grid)) return;

	/* Different treatment for different walls */
	if (square_isrubble(cave, grid)) {
		/* Message */
		if (square_isseen(cave, grid)) {
			msg("The rubble turns into mud!");
			context->obvious = true;

			/* Forget the wall */
			square_forget(cave, grid);
		}

		/* Destroy the rubble */
		square_destroy_rubble(cave, grid);

		/* Hack -- place an object */
		if (randint0(100) < 10){
			place_object(cave, grid, player->depth, false, false,
						 ORIGIN_RUBBLE, 0);
			if (square_object(cave, grid)
					&& !ignore_item_ok(player,
					square_object(cave, grid))
					&& square_isseen(cave, grid)) {
				msg("There was something buried in the rubble!");
				context->obvious = true;
			}
		}
	} else if (square_isdoor(cave, grid)) {
		/* Hack -- special message */
		if (square_isseen(cave, grid)) {
			msg("The door turns into mud!");
			context->obvious = true;

			/* Forget the wall */
			square_forget(cave, grid);
		}

		/* Destroy the feature */
		square_destroy_door(cave, grid);
	} else if (square_hasgoldvein(cave, grid)) {
		/* Message */
		if (square_isseen(cave, grid)) {
			msg("The vein turns into mud!");
			msg("You have found something!");
			context->obvious = true;

			/* Forget the wall */
			square_forget(cave, grid);
		}

		/* Destroy the wall */
		square_destroy_wall(cave, grid);

		/* Place some gold */
		place_gold(cave, grid, player->depth, ORIGIN_FLOOR);
	} else if (square_ismagma(cave, grid) || square_isquartz(cave, grid)) {
		/* Message */
		if (square_isseen(cave, grid)) {
			msg("The vein turns into mud!");
			context->obvious = true;

			/* Forget the wall */
			square_forget(cave, grid);
		}

		/* Destroy the wall */
		square_destroy_wall(cave, grid);
	} else if (square_isgranite(cave, grid)) {
		/* Message */
		if (square_isseen(cave, grid)) {
			msg("The wall turns into mud!");
			context->obvious = true;

			/* Forget the wall */
			square_forget(cave, grid);
		}

		/* Destroy the wall */
		square_destroy_wall(cave, grid);
	}

	/* On the surface, new terrain may be exposed to the sun. */
	if (cave->depth == 0) expose_to_sun(cave, grid, is_daytime());

	/* Update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
}